

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentErrorsTest::Clean
          (TextureAttachmentErrorsTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureAttachmentErrorsTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_valid != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_valid);
    this->m_fbo_valid = 0;
  }
  if (this->m_to_valid != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_valid);
    this->m_to_valid = 0;
  }
  if (this->m_tbo_valid != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_tbo_valid);
    this->m_tbo_valid = 0;
  }
  if (this->m_to_3d_valid != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_3d_valid);
    this->m_to_3d_valid = 0;
  }
  if (this->m_to_array_valid != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_array_valid);
    this->m_to_array_valid = 0;
  }
  if (this->m_to_cubearray_valid != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_cubearray_valid);
    this->m_to_cubearray_valid = 0;
  }
  if (this->m_to_layer_invalid != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_layer_invalid);
    this->m_to_layer_invalid = 0;
  }
  this->m_fbo_invalid = 0;
  this->m_to_invalid = 0;
  this->m_attachment_invalid = 0;
  this->m_level_invalid = 0;
  this->m_max_3d_texture_size = 0x800;
  this->m_max_3d_texture_depth = this->m_max_3d_texture_size;
  this->m_max_array_texture_layers = 0x800;
  this->m_max_cube_map_texture_size = 0x4000;
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void TextureAttachmentErrorsTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release GL objects. */
	if (m_fbo_valid)
	{
		gl.deleteFramebuffers(1, &m_fbo_valid);
		m_fbo_valid = 0;
	}

	if (m_to_valid)
	{
		gl.deleteTextures(1, &m_to_valid);
		m_to_valid = 0;
	}

	if (m_tbo_valid)
	{
		gl.deleteTextures(1, &m_tbo_valid);
		m_tbo_valid = 0;
	}

	if (m_to_3d_valid)
	{
		gl.deleteTextures(1, &m_to_3d_valid);
		m_to_3d_valid = 0;
	}

	if (m_to_array_valid)
	{
		gl.deleteTextures(1, &m_to_array_valid);
		m_to_array_valid = 0;
	}

	if (m_to_cubearray_valid)
	{
		gl.deleteTextures(1, &m_to_cubearray_valid);
		m_to_cubearray_valid = 0;
	}

	if (m_to_layer_invalid)
	{
		gl.deleteTextures(1, &m_to_layer_invalid);
		m_to_layer_invalid = 0;
	}

	/* Set initial values - all test shall have the same environment. */
	m_fbo_invalid		 = 0;
	m_to_invalid		 = 0;
	m_attachment_invalid = 0;
	m_level_invalid		 = 0;

	m_max_3d_texture_size		= 2048;
	m_max_3d_texture_depth		= m_max_3d_texture_size;
	m_max_array_texture_layers  = 2048;
	m_max_cube_map_texture_size = 16384;

	/* Errors clean up. */
	while (gl.getError())
		;
}